

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

string * kwssys::SystemTools::CropString(string *__return_storage_ptr__,string *s,size_t max_len)

{
  pointer pcVar1;
  ulong uVar2;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  uVar2 = s->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (max_len == 0 || uVar2 <= max_len) {
    pcVar1 = (s->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + uVar2);
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    uVar2 = max_len >> 1;
    std::__cxx11::string::assign((string *)__return_storage_ptr__,(ulong)s,0);
    std::__cxx11::string::substr((ulong)local_48,(ulong)s);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
    if (((2 < max_len) && ((__return_storage_ptr__->_M_dataplus)._M_p[uVar2] = '.', max_len != 3))
       && ((__return_storage_ptr__->_M_dataplus)._M_p[uVar2 - 1] = '.', 4 < max_len)) {
      (__return_storage_ptr__->_M_dataplus)._M_p[uVar2 + 1] = '.';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::CropString(const std::string& s, size_t max_len)
{
  if (s.empty() || max_len == 0 || max_len >= s.size()) {
    return s;
  }

  std::string n;
  n.reserve(max_len);

  size_t middle = max_len / 2;

  n.assign(s, 0, middle);
  n += s.substr(s.size() - (max_len - middle));

  if (max_len > 2) {
    n[middle] = '.';
    if (max_len > 3) {
      n[middle - 1] = '.';
      if (max_len > 4) {
        n[middle + 1] = '.';
      }
    }
  }

  return n;
}